

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void disas_cas2l(CPUM68KState_conflict *env,DisasContext_conflict2 *s,uint16_t insn)

{
  TCGContext_conflict2 *tcg_ctx;
  TCGv_i32 pTVar1;
  TCGv_i32 pTVar2;
  uint32_t uVar3;
  uint uVar4;
  uint32_t uVar5;
  TCGv_i32 pTVar6;
  TCGv_i32 *ppTVar7;
  abi_ptr_conflict addr;
  code *func;
  TCGTemp *local_58;
  TCGTemp *local_50;
  TCGv_i32 local_48;
  TCGv_i32 local_40;
  
  tcg_ctx = s->uc->tcg_ctx;
  uVar3 = cpu_lduw_code_m68k(env,s->pc);
  addr = s->pc + 2;
  s->pc = addr;
  if ((short)uVar3 < 0) {
    uVar4 = uVar3 >> 0xc & 7;
    if (((uint)s->writeback_mask >> uVar4 & 1) == 0) {
      ppTVar7 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar7 = s->writeback;
    }
  }
  else {
    ppTVar7 = tcg_ctx->cpu_dregs;
    uVar4 = (uVar3 & 0xffff) >> 0xc;
  }
  pTVar1 = ppTVar7[uVar4];
  uVar5 = cpu_lduw_code_m68k(env,addr);
  s->pc = s->pc + 2;
  if ((short)uVar5 < 0) {
    uVar4 = uVar5 >> 0xc & 7;
    if (((uint)s->writeback_mask >> uVar4 & 1) == 0) {
      ppTVar7 = s->uc->tcg_ctx->cpu_aregs;
    }
    else {
      ppTVar7 = s->writeback;
    }
  }
  else {
    ppTVar7 = tcg_ctx->cpu_dregs;
    uVar4 = (uVar5 & 0xffff) >> 0xc;
  }
  pTVar2 = ppTVar7[uVar4];
  pTVar6 = tcg_const_i32_m68k(tcg_ctx,(uVar3 & 7) << 9 | uVar3 >> 3 & 0x38 | uVar5 >> 6 & 7 |
                                      (uVar5 & 7) << 6);
  local_58 = (TCGTemp *)(tcg_ctx->cpu_env + (long)tcg_ctx);
  local_48 = pTVar1 + (long)tcg_ctx;
  if ((((s->base).tb)->cflags & 0x80000) == 0) {
    func = helper_cas2l_m68k;
  }
  else {
    func = helper_cas2l_parallel_m68k;
  }
  local_50 = (TCGTemp *)(pTVar6 + (long)tcg_ctx);
  local_40 = pTVar2 + (long)tcg_ctx;
  tcg_gen_callN_m68k(tcg_ctx,func,(TCGTemp *)0x0,4,&local_58);
  tcg_temp_free_internal_m68k(tcg_ctx,(TCGTemp *)(pTVar6 + (long)tcg_ctx));
  s->cc_op = CC_OP_CMPL;
  s->cc_op_synced = 1;
  return;
}

Assistant:

DISAS_INSN(cas2l)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    uint16_t ext1, ext2;
    TCGv addr1, addr2, regs;

    /* cas2 Dc1:Dc2,Du1:Du2,(Rn1):(Rn2) */

    ext1 = read_im16(env, s);

    if (ext1 & 0x8000) {
        /* Address Register */
        addr1 = AREG(ext1, 12);
    } else {
        /* Data Register */
        addr1 = DREG(ext1, 12);
    }

    ext2 = read_im16(env, s);
    if (ext2 & 0x8000) {
        /* Address Register */
        addr2 = AREG(ext2, 12);
    } else {
        /* Data Register */
        addr2 = DREG(ext2, 12);
    }

    /*
     * if (R1) == Dc1 && (R2) == Dc2 then
     *     (R1) = Du1
     *     (R2) = Du2
     * else
     *     Dc1 = (R1)
     *     Dc2 = (R2)
     */

    regs = tcg_const_i32(tcg_ctx, REG(ext2, 6) |
                         (REG(ext1, 6) << 3) |
                         (REG(ext2, 0) << 6) |
                         (REG(ext1, 0) << 9));
    if (tb_cflags(s->base.tb) & CF_PARALLEL) {
        gen_helper_cas2l_parallel(tcg_ctx, tcg_ctx->cpu_env, regs, addr1, addr2);
    } else {
        gen_helper_cas2l(tcg_ctx, tcg_ctx->cpu_env, regs, addr1, addr2);
    }
    tcg_temp_free(tcg_ctx, regs);

    /* Note that cas2l also assigned to env->cc_op.  */
    s->cc_op = CC_OP_CMPL;
    s->cc_op_synced = 1;
}